

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_waveform_generation.cc
# Opt level: O0

void __thiscall
sptk::PeriodicWaveformGeneration::PeriodicWaveformGeneration
          (PeriodicWaveformGeneration *this,double unvoiced_value,bool strict,
          InputSourceInterpolationWithMagicNumber *input_source)

{
  ulong uVar1;
  undefined8 in_RDX;
  byte in_SIL;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  
  *in_RDI = &PTR__PeriodicWaveformGeneration_00127be0;
  in_RDI[1] = in_XMM0_Qa;
  *(byte *)(in_RDI + 2) = in_SIL & 1;
  in_RDI[3] = in_RDX;
  *(undefined1 *)(in_RDI + 4) = 1;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  *(undefined1 *)(in_RDI + 7) = 0;
  if ((in_RDI[3] != 0) && (uVar1 = (**(code **)(*(long *)in_RDI[3] + 0x18))(), (uVar1 & 1) != 0)) {
    return;
  }
  *(undefined1 *)(in_RDI + 4) = 0;
  return;
}

Assistant:

PeriodicWaveformGeneration::PeriodicWaveformGeneration(
    double unvoiced_value, bool strict,
    InputSourceInterpolationWithMagicNumber* input_source)
    : unvoiced_value_(unvoiced_value),
      strict_(strict),
      input_source_(input_source),
      is_valid_(true),
      phase_(0.0),
      voiced_pitch_(0.0),
      extending_(false) {
  if (NULL == input_source_ || !input_source_->IsValid()) {
    is_valid_ = false;
    return;
  }
}